

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  key_type kVar7;
  key_type kVar8;
  key_type kVar9;
  value_type actual_predicate_value;
  AssertHelper *this_00;
  value_type vVar10;
  char *pcVar11;
  size_type sVar12;
  bool *success;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  stringstream string_buffer;
  int i;
  TypeParam ht_out;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  pair<const_int,_int> *in_stack_fffffffffffff9c8;
  int iVar13;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  key_equal *in_stack_fffffffffffff9d8;
  int line;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  size_type in_stack_fffffffffffff9e8;
  Type TVar14;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  char *in_stack_fffffffffffffa28;
  undefined6 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa36;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  value_type in_stack_fffffffffffffa40;
  string local_588 [48];
  key_type local_558;
  undefined1 local_551;
  AssertionResult local_550;
  string local_540 [48];
  key_type local_510;
  undefined1 local_509;
  AssertionResult local_508 [2];
  key_type local_4e4;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_4e0;
  value_type local_4c0;
  AssertionResult local_4b8;
  string local_4a8 [48];
  key_type local_478;
  undefined1 local_471;
  AssertionResult local_470 [2];
  key_type local_44c;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_448;
  value_type local_428;
  AssertionResult local_420 [2];
  key_type local_3fc;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3f8;
  value_type local_3d8;
  AssertionResult local_3d0;
  string local_3c0 [55];
  undefined1 local_389;
  AssertionResult local_388;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_378 [2];
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_350;
  string local_2d0 [55];
  undefined1 local_299;
  AssertionResult local_298;
  stringstream local_288 [392];
  key_type local_100;
  key_type local_fc;
  value_type local_cc;
  int local_c4;
  key_type local_c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0 [2];
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_88;
  
  bVar1 = google::
          HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b0,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
               (hasher *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               in_stack_fffffffffffff9d8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b0);
    local_c0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                           (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                      (key_type *)in_stack_fffffffffffff9b8);
    for (local_c4 = 1; local_c4 < 100; local_c4 = local_c4 + 1) {
      in_stack_fffffffffffffa40 =
           HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff9b8,0);
      local_cc = in_stack_fffffffffffffa40;
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffffa40,
               (value_type *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    }
    kVar4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                        (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    local_fc = kVar4;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
            (key_type *)in_stack_fffffffffffff9b8);
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                        (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    local_100 = kVar5;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
            (key_type *)in_stack_fffffffffffff9b8);
    std::__cxx11::stringstream::stringstream(local_288);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                      (&local_88,local_288);
    local_299 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (bool *)in_stack_fffffffffffff9b8,(type *)0xf9c447);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa36,in_stack_fffffffffffffa30
                                                )),in_stack_fffffffffffffa28,
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,(Type)(in_stack_fffffffffffff9e8 >> 0x20)
                 ,(char *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      std::__cxx11::string::~string(local_2d0);
      testing::Message::~Message((Message *)0xf9c523);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9c5ba);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_378,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
               (hasher *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               in_stack_fffffffffffff9d8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    TVar14 = (Type)(in_stack_fffffffffffff9e8 >> 0x20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_378);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                      (&local_350,local_288);
    local_389 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (bool *)in_stack_fffffffffffff9b8,(type *)0xf9c668);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa30)),
                 in_stack_fffffffffffffa28,
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      std::__cxx11::string::~string(local_3c0);
      testing::Message::~Message((Message *)0xf9c77c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9c813);
    actual_predicate_value =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff9b8,0);
    local_3d8 = actual_predicate_value;
    kVar6 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                        (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    local_3fc = kVar6;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa00,
           (key_type *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    google::
    dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_3f8);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff9d8,
               (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      testing::AssertionResult::failure_message((AssertionResult *)0xf9c8f6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::Message::~Message((Message *)0xf9c953);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9c9c4);
    local_428 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff9b8,0);
    local_44c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                            (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa00,
           (key_type *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    google::
    dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_448);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff9d8,
               (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_420);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      in_stack_fffffffffffffa00 =
           (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf9caa7);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::Message::~Message((Message *)0xf9cb04);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9cb75);
    kVar7 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                        (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    local_478 = kVar7;
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                      (key_type *)in_stack_fffffffffffff9b8);
    local_471 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (bool *)in_stack_fffffffffffff9b8,(type *)0xf9cbdd);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_470);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa30)),
                 (char *)actual_predicate_value,(char *)CONCAT44(kVar6,in_stack_fffffffffffffa20));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      std::__cxx11::string::~string(local_4a8);
      testing::Message::~Message((Message *)0xf9ccb2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9cd49);
    vVar10 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff9b8,0);
    local_4c0 = vVar10;
    kVar8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                        (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    TVar14 = vVar10.second;
    local_4e4 = kVar8;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa00,(key_type *)CONCAT44(kVar7,in_stack_fffffffffffff9f8));
    google::
    dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_4e0);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff9d8,
               (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
              );
    line = (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
    iVar13 = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0xf9ce2c);
      line = (int)((ulong)pcVar11 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,(char *)CONCAT44(kVar8,in_stack_fffffffffffff9e0),line,
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::Message::~Message((Message *)0xf9ce89);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9cefa);
    kVar7 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),iVar13);
    local_510 = kVar7;
    sVar12 = google::
             BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                     (key_type *)in_stack_fffffffffffff9b8);
    local_509 = sVar12 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (bool *)in_stack_fffffffffffff9b8,(type *)0xf9cf62);
    iVar13 = (int)(sVar12 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa30)),
                 (char *)actual_predicate_value,(char *)CONCAT44(kVar6,in_stack_fffffffffffffa20));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,(char *)CONCAT44(kVar8,in_stack_fffffffffffff9e0),line,
                 (char *)CONCAT44(kVar7,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      std::__cxx11::string::~string(local_540);
      testing::Message::~Message((Message *)0xf9d037);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9d0ce);
    kVar9 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(kVar7,in_stack_fffffffffffff9d0),iVar13);
    local_558 = kVar9;
    success = (bool *)google::
                      BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(kVar9,in_stack_fffffffffffff9c0),
                              (key_type *)in_stack_fffffffffffff9b8);
    local_551 = success == (bool *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(kVar9,in_stack_fffffffffffff9c0),success,(type *)0xf9d134
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_550);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa30)),
                 (char *)actual_predicate_value,(char *)CONCAT44(kVar6,in_stack_fffffffffffffa20));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,(char *)CONCAT44(kVar8,in_stack_fffffffffffff9e0),line,
                 (char *)CONCAT44(kVar7,in_stack_fffffffffffff9d0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffa40,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(kVar9,in_stack_fffffffffffff9c0));
      std::__cxx11::string::~string(local_588);
      testing::Message::~Message((Message *)0xf9d209);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9d29d);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf9d2aa);
    std::__cxx11::stringstream::~stringstream(local_288);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf9d2c4);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}